

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[10],wabt::Type,char_const(&)[5],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],TagSymbol *u,char (*args) [10],Type *args_1,
          char (*args_2) [5],StackVar *args_3,char (*args_4) [3],Newline *args_5)

{
  string_view local_48;
  char (*local_38) [5];
  char (*args_local_2) [5];
  Type *args_local_1;
  char (*args_local) [10];
  TagSymbol *u_local;
  char (*t_local) [24];
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [5])args_1;
  args_local_1 = (Type *)args;
  args_local = (char (*) [10])u;
  u_local = (TagSymbol *)t;
  t_local = (char (*) [24])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this,(TagSymbol *)args_local);
  Write<char_const(&)[10],wabt::Type,char_const(&)[5],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            (this,(char (*) [10])args_local_1,(Type *)args_local_2,local_38,args_3,args_4,args_5);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }